

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_custom_notification.cxx
# Opt level: O0

ptr<resp_msg> __thiscall
nuraft::raft_server::handle_out_of_log_msg
          (raft_server *this,req_msg *req,ptr<custom_notification_msg> *msg,ptr<resp_msg> *resp)

{
  bool bVar1;
  int iVar2;
  srv_role sVar3;
  __int_type_conflict leader_id;
  element_type *peVar4;
  element_type *peVar5;
  long lVar6;
  cb_func *pcVar7;
  cb_func *this_00;
  element_type *peVar8;
  timer_helper *in_RCX;
  msg_base *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  element_type *in_RDI;
  ptr<resp_msg> pVar9;
  OutOfLogRangeWarningArgs args;
  Param param;
  ptr<out_of_log_msg> ool_msg;
  int log_lv;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  Type type;
  size_t in_stack_ffffffffffffff18;
  timer_helper *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  raft_server *in_stack_ffffffffffffff38;
  ulong uVar10;
  OutOfLogRangeWarningArgs local_88;
  Param local_80;
  string local_68 [48];
  int local_38;
  raft_server *in_stack_ffffffffffffffd0;
  
  if ((handle_out_of_log_msg(nuraft::req_msg&,std::shared_ptr<nuraft::custom_notification_msg>,std::shared_ptr<nuraft::resp_msg>)
       ::msg_timer == '\0') &&
     (iVar2 = __cxa_guard_acquire(&handle_out_of_log_msg(nuraft::req_msg&,std::shared_ptr<nuraft::custom_notification_msg>,std::shared_ptr<nuraft::resp_msg>)
                                   ::msg_timer), iVar2 != 0)) {
    timer_helper::timer_helper
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
               SUB41((uint)in_stack_ffffffffffffff14 >> 0x18,0));
    __cxa_guard_release(&handle_out_of_log_msg(nuraft::req_msg&,std::shared_ptr<nuraft::custom_notification_msg>,std::shared_ptr<nuraft::resp_msg>)
                         ::msg_timer);
  }
  bVar1 = timer_helper::timeout_and_reset(in_RCX);
  local_38 = 6;
  if (bVar1) {
    local_38 = 3;
  }
  msg_base::get_term(in_RDX);
  update_term(in_stack_ffffffffffffff38,
              CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  std::atomic<bool>::operator=
            ((atomic<bool> *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             (bool)in_stack_ffffffffffffff0f);
  std::
  __shared_ptr_access<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x46cb1d);
  std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  out_of_log_msg::deserialize((buffer *)in_RCX);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
  if (bVar1) {
    peVar4 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x46cb64);
    iVar2 = (**(code **)(*(long *)peVar4 + 0x38))();
    if (local_38 <= iVar2) {
      peVar4 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x46cb98);
      iVar2 = local_38;
      peVar8 = std::
               __shared_ptr_access<nuraft::out_of_log_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::out_of_log_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x46cbb5);
      uVar10 = peVar8->start_idx_of_leader_;
      peVar5 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x46cbce);
      lVar6 = (**(code **)(*(long *)peVar5 + 0x10))();
      msg_if_given_abi_cxx11_
                ((char *)local_68,
                 "this node is out of log range. leader\'s start index: %lu, my last index: %lu",
                 uVar10,lVar6 + -1);
      (**(code **)(*(long *)peVar4 + 0x40))
                (peVar4,iVar2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_custom_notification.cxx"
                 ,"handle_out_of_log_msg",0xc2,local_68);
      std::__cxx11::string::~string(local_68);
    }
  }
  pcVar7 = (cb_func *)msg_base::get_term(in_RDX);
  std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x46ccce);
  this_00 = (cb_func *)srv_state::get_term((srv_state *)0x46ccd6);
  if ((pcVar7 == this_00) &&
     (sVar3 = std::atomic::operator_cast_to_srv_role((atomic<nuraft::srv_role> *)0x46ccfd),
     sVar3 == follower)) {
    restart_election_timer(in_stack_ffffffffffffffd0);
  }
  type = *(Type *)(in_RSI + 0x38);
  leader_id = std::__atomic_base::operator_cast_to_int((__atomic_base<int> *)this_00);
  cb_func::Param::Param(&local_80,type,leader_id,-1,(void *)0x0);
  peVar8 = std::
           __shared_ptr_access<nuraft::out_of_log_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::out_of_log_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x46cd4e);
  cb_func::OutOfLogRangeWarningArgs::OutOfLogRangeWarningArgs
            (&local_88,peVar8->start_idx_of_leader_);
  local_80.ctx = &local_88;
  std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
            ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x46cd7b);
  cb_func::call(this_00,type,(Param *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08))
  ;
  std::shared_ptr<nuraft::resp_msg>::shared_ptr
            ((shared_ptr<nuraft::resp_msg> *)CONCAT44(type,in_stack_ffffffffffffff10),
             (shared_ptr<nuraft::resp_msg> *)
             CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
  std::shared_ptr<nuraft::out_of_log_msg>::~shared_ptr
            ((shared_ptr<nuraft::out_of_log_msg> *)0x46cdaf);
  pVar9.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar9.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ptr<resp_msg>)pVar9.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_out_of_log_msg(req_msg& req,
                                                 ptr<custom_notification_msg> msg,
                                                 ptr<resp_msg> resp)
{
    static timer_helper msg_timer(5000000);
    int log_lv = msg_timer.timeout_and_reset() ? L_WARN : L_TRACE;

    // As it is a special form of heartbeat, need to update term.
    update_term(req.get_term());

    out_of_log_range_ = true;

    ptr<out_of_log_msg> ool_msg = out_of_log_msg::deserialize(*msg->ctx_);
    p_lv(log_lv, "this node is out of log range. leader's start index: %" PRIu64 ", "
         "my last index: %" PRIu64,
         ool_msg->start_idx_of_leader_,
         log_store_->next_slot() - 1);

    // Should restart election timer to avoid initiating false vote.
    if ( req.get_term() == state_->get_term() &&
         role_ == srv_role::follower ) {
        restart_election_timer();
    }

    cb_func::Param param(id_, leader_);
    cb_func::OutOfLogRangeWarningArgs args(ool_msg->start_idx_of_leader_);
    param.ctx = &args;
    ctx_->cb_func_.call(cb_func::OutOfLogRangeWarning, &param);

    return resp;
}